

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O2

void __thiscall
helics::apps::setGeneratorProperty(apps *this,SignalGenerator *gen,string_view name,json *prop)

{
  Time TVar1;
  json *timeElement;
  size_t sVar2;
  undefined8 local_50;
  undefined8 local_48;
  
  timeElement = (json *)name._M_str;
  sVar2 = name._M_len;
  if ((byte)((timeElement->m_data).m_type - number_integer) < 3) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<double,_0>(timeElement);
    (**(code **)(*(long *)this + 0x10))(this,gen,sVar2);
    return;
  }
  TVar1 = fileops::loadJsonTime(timeElement,sec);
  if (TVar1.internalTimeCode < -0x7ffffffffffffffe) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_50,timeElement);
    (**(code **)(*(long *)this + 0x18))(this,gen,sVar2,local_48,local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    (**(code **)(*(long *)this + 0x10))
              ((double)(TVar1.internalTimeCode % 1000000000) * 1e-09 +
               (double)(TVar1.internalTimeCode / 1000000000),this,gen,sVar2);
  }
  return;
}

Assistant:

static void setGeneratorProperty(SignalGenerator* gen,
                                     std::string_view name,
                                     const nlohmann::json& prop)
    {
        if (prop.is_number()) {
            gen->set(name, prop.get<double>());
        } else {
            try {
                auto time = fileops::loadJsonTime(prop);
                if (time > Time::minVal()) {
                    gen->set(name, static_cast<double>(time));
                } else {
                    gen->setString(name, prop.get<std::string>());
                }
            }
            catch (const std::invalid_argument&) {
                gen->setString(name, prop.get<std::string>());
            }
        }
    }